

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O3

int USHAResult(USHAContext *ctx,uint8_t *Message_Digest)

{
  int iVar1;
  
  if (ctx != (USHAContext *)0x0) {
    switch(ctx->whichSha) {
    case 0:
      iVar1 = SHA1Result(&(ctx->ctx).sha1Context,Message_Digest);
      return iVar1;
    case 1:
      iVar1 = SHA224Result(&(ctx->ctx).sha224Context,Message_Digest);
      return iVar1;
    case 2:
      iVar1 = SHA256Result(&(ctx->ctx).sha256Context,Message_Digest);
      return iVar1;
    case 3:
      iVar1 = SHA384Result(&(ctx->ctx).sha384Context,Message_Digest);
      return iVar1;
    case 4:
      iVar1 = SHA512Result(&(ctx->ctx).sha512Context,Message_Digest);
      return iVar1;
    default:
      return 4;
    }
  }
  return 1;
}

Assistant:

int USHAResult(USHAContext *ctx,
    uint8_t Message_Digest[USHAMaxHashSize])
{
    if (ctx) {
        switch (ctx->whichSha) {
        case SHA1:
            return SHA1Result((SHA1Context*)&ctx->ctx, Message_Digest);
        case SHA224:
            return SHA224Result((SHA224Context*)&ctx->ctx, Message_Digest);
        case SHA256:
            return SHA256Result((SHA256Context*)&ctx->ctx, Message_Digest);
        case SHA384:
            return SHA384Result((SHA384Context*)&ctx->ctx, Message_Digest);
        case SHA512:
            return SHA512Result((SHA512Context*)&ctx->ctx, Message_Digest);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}